

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::draw(Text *this,RenderTarget *target,RenderStates states)

{
  Texture *pTVar1;
  long in_RDI;
  RenderStates *in_stack_000000b0;
  Drawable *in_stack_000000b8;
  RenderTarget *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  Font *this_00;
  
  this_00 = (Font *)&stack0x00000008;
  if (*(long *)(in_RDI + 0xd8) != 0) {
    ensureGeometryUpdate((Text *)in_stack_000000c0);
    Transformable::getTransform((Transformable *)states.transform.m_matrix._8_8_);
    operator*=((Transform *)this_00,
               (Transform *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    pTVar1 = Font::getTexture(this_00,in_stack_ffffffffffffffdc);
    *(Texture **)&(this_00->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header = pTVar1;
    if ((*(float *)(in_RDI + 0xf8) != 0.0) || (NAN(*(float *)(in_RDI + 0xf8)))) {
      RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    }
    RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  return;
}

Assistant:

void Text::draw(RenderTarget& target, RenderStates states) const
{
    if (m_font)
    {
        ensureGeometryUpdate();

        states.transform *= getTransform();
        states.texture = &m_font->getTexture(m_characterSize);

        // Only draw the outline if there is something to draw
        if (m_outlineThickness != 0)
            target.draw(m_outlineVertices, states);

        target.draw(m_vertices, states);
    }
}